

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cpp
# Opt level: O0

void __thiscall CFlag::Snap(CFlag *this,int SnappingClient)

{
  int iVar1;
  IServer *pIVar2;
  int *piVar3;
  CEntity *in_RDI;
  CNetObj_Flag *pFlag;
  int in_stack_ffffffffffffffdc;
  undefined4 extraout_var;
  
  iVar1 = CEntity::NetworkClipped(in_RDI,in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    pIVar2 = CEntity::Server((CEntity *)0x11c6f5);
    iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])
                      (pIVar2,5,(ulong)*(uint *)&in_RDI[1]._vptr_CEntity,0xc);
    piVar3 = (int *)CONCAT44(extraout_var,iVar1);
    if (piVar3 != (int *)0x0) {
      iVar1 = round_to_int((in_RDI->m_Pos).field_0.x);
      *piVar3 = iVar1;
      iVar1 = round_to_int((in_RDI->m_Pos).field_1.y);
      piVar3[1] = iVar1;
      piVar3[2] = *(int *)&in_RDI[1]._vptr_CEntity;
    }
  }
  return;
}

Assistant:

void CFlag::Snap(int SnappingClient)
{
	if(NetworkClipped(SnappingClient))
		return;

	CNetObj_Flag *pFlag = (CNetObj_Flag *)Server()->SnapNewItem(NETOBJTYPE_FLAG, m_Team, sizeof(CNetObj_Flag));
	if(!pFlag)
		return;

	pFlag->m_X = round_to_int(m_Pos.x);
	pFlag->m_Y = round_to_int(m_Pos.y);
	pFlag->m_Team = m_Team;
}